

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cloud.c
# Opt level: O1

REF_STATUS ref_cloud_item(REF_CLOUD ref_cloud,REF_GLOB global,REF_INT *item)

{
  long lVar1;
  
  *item = -1;
  if (0 < (long)ref_cloud->n) {
    lVar1 = 0;
    do {
      if (ref_cloud->global[lVar1] == global) {
        *item = (REF_INT)lVar1;
        return 0;
      }
      lVar1 = lVar1 + 1;
    } while (ref_cloud->n != lVar1);
  }
  return 5;
}

Assistant:

REF_FCN REF_STATUS ref_cloud_item(REF_CLOUD ref_cloud, REF_GLOB global,
                                  REF_INT *item) {
  REF_INT i;

  *item = REF_EMPTY;

  each_ref_cloud_item(ref_cloud, i) {
    if (global == ref_cloud_global(ref_cloud, i)) {
      *item = i;
      return REF_SUCCESS;
    }
  }

  return REF_NOT_FOUND;
}